

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QTreeWidgetItem_*>::data(QList<QTreeWidgetItem_*> *this)

{
  QArrayDataPointer<QTreeWidgetItem_*> *this_00;
  QTreeWidgetItem **ppQVar1;
  QArrayDataPointer<QTreeWidgetItem_*> *in_RDI;
  
  detach((QList<QTreeWidgetItem_*> *)0x9235ec);
  this_00 = (QArrayDataPointer<QTreeWidgetItem_*> *)
            QArrayDataPointer<QTreeWidgetItem_*>::operator->(in_RDI);
  ppQVar1 = QArrayDataPointer<QTreeWidgetItem_*>::data(this_00);
  return ppQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }